

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node_struct *n,xpath_allocator *alloc)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  xpath_node *pxVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  xpath_node local_38;
  xml_node local_28;
  
  if (n == (xml_node_struct *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x273d,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  if (7 < (byte)this->_test - 1) {
    __assert_fail("false && \"Unknown axis\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x2780,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  uVar5 = (uint)n->header & 0xf;
  switch((uint)(byte)this->_test) {
  case 1:
    if (uVar5 != 2) {
      return false;
    }
    goto LAB_0038f073;
  case 2:
    goto switchD_0038f007_caseD_2;
  case 3:
    if (uVar5 == 5) goto switchD_0038f007_caseD_2;
    break;
  case 4:
    if (uVar5 == 6) goto switchD_0038f007_caseD_2;
    break;
  case 5:
    if (uVar5 - 3 < 2) goto switchD_0038f007_caseD_2;
    break;
  case 6:
    if (uVar5 != 6) {
      return false;
    }
LAB_0038f073:
    if ((n->name != (char_t *)0x0) && (bVar7 = strequal(n->name,(this->_data).string), bVar7)) {
switchD_0038f007_caseD_2:
      xml_node::xml_node(&local_28,n);
      xpath_node::xpath_node(&local_38,&local_28);
      pxVar4 = ns->_end;
      if (pxVar4 == ns->_eos) {
        xpath_node_set_raw::push_back_grow(ns,&local_38,alloc);
      }
      else {
        ns->_end = pxVar4 + 1;
        (pxVar4->_node)._root = local_38._node._root;
        (pxVar4->_attribute)._attr = local_38._attribute._attr;
      }
      return true;
    }
    break;
  case 7:
    if (uVar5 == 2) goto switchD_0038f007_caseD_2;
    break;
  case 8:
    if ((uVar5 == 2) && (pcVar3 = n->name, pcVar3 != (char *)0x0)) {
      cVar2 = *(this->_data).string;
      bVar7 = cVar2 == '\0';
      if ((!bVar7) && (*pcVar3 == cVar2)) {
        lVar6 = 1;
        do {
          cVar2 = (this->_data).string[lVar6];
          bVar7 = cVar2 == '\0';
          if (bVar7) break;
          pcVar1 = pcVar3 + lVar6;
          lVar6 = lVar6 + 1;
        } while (*pcVar1 == cVar2);
      }
      if (bVar7) goto switchD_0038f007_caseD_2;
    }
  }
  return false;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc)
		{
			assert(n);

			xml_node_type type = PUGI_IMPL_NODETYPE(n);

			switch (_test)
			{
			case nodetest_name:
				if (type == node_element && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
				ns.push_back(xml_node(n), alloc);
				return true;

			case nodetest_type_comment:
				if (type == node_comment)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_text:
				if (type == node_pcdata || type == node_cdata)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_pi:
				if (type == node_pi)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_pi:
				if (type == node_pi && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all:
				if (type == node_element)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (type == node_element && n->name && starts_with(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			default:
				assert(false && "Unknown axis"); // unreachable
			}

			return false;
		}